

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> *this)

{
  NullableValue<kj::Promise<kj::AuthenticatedStream>_>::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}